

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ClosePopupsOverWindow(ImGuiWindow *ref_window,bool restore_focus_to_window_under_popup)

{
  ImGuiWindow **ppIVar1;
  uint uVar2;
  ImGuiPopupData *pIVar3;
  ImGuiWindow *pIVar4;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  ImGuiWindow *pIVar9;
  int n;
  ulong uVar10;
  
  uVar2 = (GImGui->OpenPopupStack).Size;
  uVar8 = (ulong)uVar2;
  if (uVar8 != 0) {
    uVar7 = 0;
    if (0 < (int)uVar2 && ref_window != (ImGuiWindow *)0x0) {
      pIVar3 = (GImGui->OpenPopupStack).Data;
      uVar7 = 0;
      do {
        pIVar4 = pIVar3[uVar7].Window;
        if ((pIVar4 != (ImGuiWindow *)0x0) && ((pIVar4->Flags & 0x1000000) == 0)) {
          bVar6 = false;
          uVar10 = uVar7;
          do {
            pIVar4 = pIVar3[uVar10].Window;
            if (pIVar4 == (ImGuiWindow *)0x0) {
              bVar5 = true;
            }
            else {
              pIVar9 = ref_window;
              if (ref_window->RootWindow == pIVar4) {
                bVar5 = false;
LAB_0010f0b7:
                bVar6 = true;
              }
              else {
                do {
                  bVar5 = pIVar9 != pIVar4;
                  if (pIVar9 == pIVar4) goto LAB_0010f0b7;
                  ppIVar1 = &pIVar9->ParentWindowInBeginStack;
                  pIVar9 = *ppIVar1;
                } while (*ppIVar1 != (ImGuiWindow *)0x0);
              }
            }
          } while ((bVar5) && (uVar10 = uVar10 + 1, uVar10 < uVar8));
          if (!bVar6) goto LAB_0010f0d7;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar8);
      uVar7 = (ulong)uVar2;
    }
LAB_0010f0d7:
    if ((int)uVar7 < (int)uVar2) {
      ClosePopupToLevel((int)uVar7,restore_focus_to_window_under_popup);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::ClosePopupsOverWindow(ImGuiWindow* ref_window, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    if (g.OpenPopupStack.Size == 0)
        return;

    // Don't close our own child popup windows.
    int popup_count_to_keep = 0;
    if (ref_window)
    {
        // Find the highest popup which is a descendant of the reference window (generally reference window = NavWindow)
        for (; popup_count_to_keep < g.OpenPopupStack.Size; popup_count_to_keep++)
        {
            ImGuiPopupData& popup = g.OpenPopupStack[popup_count_to_keep];
            if (!popup.Window)
                continue;
            IM_ASSERT((popup.Window->Flags & ImGuiWindowFlags_Popup) != 0);
            if (popup.Window->Flags & ImGuiWindowFlags_ChildWindow)
                continue;

            // Trim the stack unless the popup is a direct parent of the reference window (the reference window is often the NavWindow)
            // - With this stack of window, clicking/focusing Popup1 will close Popup2 and Popup3:
            //     Window -> Popup1 -> Popup2 -> Popup3
            // - Each popups may contain child windows, which is why we compare ->RootWindow!
            //     Window -> Popup1 -> Popup1_Child -> Popup2 -> Popup2_Child
            bool ref_window_is_descendent_of_popup = false;
            for (int n = popup_count_to_keep; n < g.OpenPopupStack.Size; n++)
                if (ImGuiWindow* popup_window = g.OpenPopupStack[n].Window)
                    if (IsWindowWithinBeginStackOf(ref_window, popup_window))
                    {
                        ref_window_is_descendent_of_popup = true;
                        break;
                    }
            if (!ref_window_is_descendent_of_popup)
                break;
        }
    }
    if (popup_count_to_keep < g.OpenPopupStack.Size) // This test is not required but it allows to set a convenient breakpoint on the statement below
    {
        IMGUI_DEBUG_LOG_POPUP("ClosePopupsOverWindow(\"%s\") -> ClosePopupToLevel(%d)\n", ref_window->Name, popup_count_to_keep);
        ClosePopupToLevel(popup_count_to_keep, restore_focus_to_window_under_popup);
    }
}